

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

int __thiscall
helics::zeromq::ZmqCommsSS::initializeConnectionToBroker
          (ZmqCommsSS *this,socket_t *brokerConnection)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  string_view string3;
  socklen_t __len;
  sockaddr *__addr;
  int __flags;
  void *in_R8;
  socklen_t in_R9D;
  string_view name;
  string_view string1;
  string_view string2;
  vector<char,_std::allocator<char>_> buffer;
  string local_198;
  size_t local_178;
  char *pcStack_170;
  ActionMessage cmessage;
  pointer pcVar4;
  
  __len = (socklen_t)(this->super_NetworkCommsInterface).super_CommsInterface.name._M_string_length;
  zmq::detail::socket_base::setsockopt
            (&brokerConnection->super_socket_base,5,
             (int)(this->super_NetworkCommsInterface).super_CommsInterface.name._M_dataplus._M_p,
             __len,in_R8,in_R9D);
  cmessage.messageAction = cmd_time_request;
  zmq::detail::socket_base::setsockopt<int>
            (&brokerConnection->super_socket_base,0x11,&cmessage.messageAction);
  gmlc::networking::makePortAddress
            ((string *)&cmessage,
             &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress,
             (this->super_NetworkCommsInterface).brokerPort);
  zmq::detail::socket_base::connect
            (&brokerConnection->super_socket_base,cmessage.messageAction,__addr,__len);
  std::__cxx11::string::~string((string *)&cmessage);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ActionMessage::ActionMessage(&cmessage,cmd_protocol);
  cmessage.messageID = 299;
  name._M_str = (this->super_NetworkCommsInterface).super_CommsInterface.name._M_dataplus._M_p;
  name._M_len = (this->super_NetworkCommsInterface).super_CommsInterface.name._M_string_length;
  ActionMessage::name(&cmessage,name);
  pcVar1 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_dataplus._M_p;
  sVar2 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_string_length;
  pcVar4 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString._M_dataplus.
           _M_p;
  sVar3 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString._M_string_length
  ;
  NetworkCommsInterface::getAddress_abi_cxx11_(&local_198,&this->super_NetworkCommsInterface);
  local_178 = local_198._M_string_length;
  pcStack_170 = local_198._M_dataplus._M_p;
  string3._M_str = local_198._M_dataplus._M_p;
  string3._M_len = local_198._M_string_length;
  string1._M_str = pcVar1;
  string1._M_len = sVar2;
  string2._M_str = pcVar4;
  string2._M_len = sVar3;
  ActionMessage::setStringData(&cmessage,string1,string2,string3);
  __flags = (int)pcVar4;
  std::__cxx11::string::~string((string *)&local_198);
  ActionMessage::to_vector(&cmessage,&buffer);
  zmq::detail::socket_base::send
            (&brokerConnection->super_socket_base,
             (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish +
             -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,1,__flags);
  ActionMessage::~ActionMessage(&cmessage);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return 0;
}

Assistant:

int ZmqCommsSS::initializeConnectionToBroker(zmq::socket_t& brokerConnection)
{
    brokerConnection.setsockopt(ZMQ_IDENTITY, name.c_str(), name.size());
    brokerConnection.setsockopt(ZMQ_LINGER, 500);
    try {
        brokerConnection.connect(
            gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort));
    }
    catch (zmq::error_t& ze) {
        logError(std::string("unable to connect with broker at ") +
                 gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" +
                 name + ")" + ze.what());
        setTxStatus(ConnectionStatus::ERRORED);
        return -1;
    }
    std::vector<char> buffer;
    // generate a local protocol connection string to send it's identity
    ActionMessage cmessage(CMD_PROTOCOL);
    cmessage.messageID = CONNECTION_INFORMATION;
    cmessage.name(name);
    cmessage.setStringData(brokerName, brokerInitString, getAddress());
    cmessage.to_vector(buffer);
    brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                          zmq::send_flags::dontwait);
    return 0;
}